

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

Reader * __thiscall
capnp::Orphan<capnp::DynamicStruct>::getReader
          (Reader *__return_storage_ptr__,Orphan<capnp::DynamicStruct> *this)

{
  RawBrandedSchema *pRVar1;
  uint uVar2;
  uint uVar3;
  Schema local_58;
  Reader local_50;
  
  pRVar1 = (this->schema).super_Schema.raw;
  local_58.raw = pRVar1;
  Schema::getProto(&local_50,&local_58);
  uVar3 = 0;
  uVar2 = 0;
  if (0x7f < local_50._reader.dataSize) {
    uVar2 = (uint)*(ushort *)((long)local_50._reader.data + 0xe);
  }
  if (0xcf < local_50._reader.dataSize) {
    uVar3 = (uint)*(ushort *)((long)local_50._reader.data + 0x18) << 0x10;
  }
  _::OrphanBuilder::asStructReader
            (&__return_storage_ptr__->reader,&this->builder,(StructSize)(uVar3 | uVar2));
  (__return_storage_ptr__->schema).super_Schema.raw = pRVar1;
  return __return_storage_ptr__;
}

Assistant:

DynamicStruct::Reader Orphan<DynamicStruct>::getReader() const {
  return DynamicStruct::Reader(schema, builder.asStructReader(structSizeFromSchema(schema)));
}